

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O0

UBool breakiterator_cleanup(void)

{
  if (gService != (ICULocaleService *)0x0) {
    if (gService != (ICULocaleService *)0x0) {
      (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    }
    gService = (ICULocaleService *)0x0;
  }
  icu_63::UInitOnce::reset(&gInitOnceBrkiter);
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV breakiterator_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    if (gService) {
        delete gService;
        gService = NULL;
    }
    gInitOnceBrkiter.reset();
#endif
    return TRUE;
}